

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall QTextStream::setRealNumberPrecision(QTextStream *this,int precision)

{
  QTextStreamPrivate *pQVar1;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if (precision < 0) {
    local_30.context.version = 2;
    local_30.context._4_8_ = 0;
    local_30.context._12_8_ = 0;
    local_30.context.function._4_4_ = 0;
    local_30.context.category = "default";
    QMessageLogger::warning(&local_30,"QTextStream::setRealNumberPrecision: Invalid precision (%d)")
    ;
    precision = 6;
  }
  (pQVar1->params).realNumberPrecision = precision;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStream::setRealNumberPrecision(int precision)
{
    Q_D(QTextStream);
    if (precision < 0) {
        qWarning("QTextStream::setRealNumberPrecision: Invalid precision (%d)", precision);
        d->params.realNumberPrecision = 6;
        return;
    }
    d->params.realNumberPrecision = precision;
}